

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  pointer *dbname;
  long *plVar1;
  DB DVar2;
  unsigned_long *puVar3;
  iterator iVar4;
  char cVar5;
  bool bVar6;
  VersionEdit *in_RCX;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar10;
  Status s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  FileType type;
  char buf [50];
  SequenceNumber max_sequence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  uint64_t number;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  DB local_160;
  unsigned_long *local_158;
  iterator iStack_150;
  unsigned_long *local_148;
  FileType local_13c;
  undefined1 local_138 [64];
  VersionEdit *local_f8;
  Logger *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  Version *local_c8;
  Version *local_c0;
  VersionSet *local_b8;
  Version *local_b0;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  _Base_ptr local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  TableCache *local_80;
  undefined1 local_78 [16];
  string local_68;
  pointer local_48;
  Slice local_40;
  
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  dbname = &(edit->new_files_).
            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_f8 = in_RCX;
  local_b8 = (VersionSet *)save_manifest;
  (**(code **)(*plVar1 + 0x48))(&local_48,plVar1,dbname);
  if (local_48 != (pointer)0x0) {
    operator_delete__(local_48);
  }
  if (*(long *)((long)&edit[1].comparator_.field_2 + 8) != 0) {
    __assert_fail("db_lock_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x11e,"Status leveldb::DBImpl::Recover(VersionEdit *, bool *)");
  }
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  LockFileName((string *)local_138,(string *)dbname);
  (**(code **)(*plVar1 + 0x68))
            (&local_160,plVar1,(string *)local_138,
             (undefined1 *)((long)&edit[1].comparator_.field_2 + 8));
  if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  if ((pointer)local_160._vptr_DB == (pointer)0x0) {
    plVar1 = (long *)(edit->comparator_)._M_string_length;
    CurrentFileName((string *)local_138,(string *)dbname);
    cVar5 = (**(code **)(*plVar1 + 0x30))(plVar1,local_138);
    if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_);
    }
    if (cVar5 == '\0') {
      if ((char)edit->last_sequence_ != '\x01') {
        local_138._0_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_138._8_8_ =
             (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8 = (undefined1  [8])0x1243ed;
        local_a0._M_p = (pointer)0x2b;
        Status::Status((Status *)this,kInvalidArgument,(Slice *)local_138,(Slice *)local_a8);
        goto LAB_001090b4;
      }
      NewDB((DBImpl *)local_138);
      DVar2._vptr_DB = local_160._vptr_DB;
      local_160._vptr_DB = (_func_int **)local_138._0_8_;
      local_138._0_8_ = DVar2._vptr_DB;
      if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
        operator_delete__(DVar2._vptr_DB);
      }
      if ((pointer)local_160._vptr_DB != (pointer)0x0) goto LAB_001090a8;
    }
    else if (*(char *)((long)&edit->last_sequence_ + 1) == '\x01') {
      local_138._0_8_ =
           (edit->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_138._8_8_ =
           (edit->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8 = (undefined1  [8])0x124419;
      local_a0._M_p = (pointer)0x20;
      Status::Status((Status *)this,kInvalidArgument,(Slice *)local_138,(Slice *)local_a8);
      goto LAB_001090b4;
    }
    VersionSet::Recover((VersionSet *)local_138,(bool *)edit[3].next_file_number_);
    DVar2._vptr_DB = local_160._vptr_DB;
    local_160._vptr_DB = (_func_int **)local_138._0_8_;
    local_138._0_8_ = DVar2._vptr_DB;
    if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
      operator_delete__(DVar2._vptr_DB);
    }
    if ((pointer)local_160._vptr_DB == (pointer)0x0) {
      local_f0 = (Logger *)0x0;
      local_c0 = *(Version **)(edit[3].next_file_number_ + 0x60);
      local_c8 = *(Version **)(edit[3].next_file_number_ + 0x68);
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      plVar1 = (long *)(edit->comparator_)._M_string_length;
      (**(code **)(*plVar1 + 0x38))(local_138,plVar1,dbname);
      DVar2._vptr_DB = local_160._vptr_DB;
      local_160._vptr_DB = (_func_int **)local_138._0_8_;
      local_138._0_8_ = DVar2._vptr_DB;
      if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
        operator_delete__(DVar2._vptr_DB);
      }
      if ((pointer)local_160._vptr_DB == (pointer)0x0) {
        local_90._M_allocated_capacity = (size_type)&local_a0;
        local_a0._M_p = local_a0._M_p & 0xffffffff00000000;
        local_98 = (_Base_ptr)0x0;
        local_80 = (TableCache *)0x0;
        local_90._8_8_ = local_90._M_allocated_capacity;
        VersionSet::AddLiveFiles
                  ((VersionSet *)edit[3].next_file_number_,
                   (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   local_a8);
        local_158 = (unsigned_long *)0x0;
        iStack_150._M_current = (unsigned_long *)0x0;
        local_148 = (unsigned_long *)0x0;
        if (local_e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar7 = 0;
          uVar8 = 0;
          do {
            bVar6 = ParseFileName((string *)
                                  ((long)&((local_e8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar7),(uint64_t *)&local_b0,&local_13c);
            if (bVar6) {
              pVar10 = std::
                       _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)local_a8,(key_type *)&local_b0);
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)local_a8,(_Base_ptr)pVar10.first._M_node,
                             (_Base_ptr)pVar10.second._M_node);
              if ((local_13c == kLogFile) && ((local_c0 <= local_b0 || (local_b0 == local_c8)))) {
                if (iStack_150._M_current == local_148) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,
                             iStack_150,(unsigned_long *)&local_b0);
                }
                else {
                  *iStack_150._M_current = (unsigned_long)local_b0;
                  iStack_150._M_current = iStack_150._M_current + 1;
                }
              }
            }
            uVar8 = uVar8 + 1;
            lVar7 = lVar7 + 0x20;
          } while (uVar8 < (ulong)((long)local_e8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_e8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        iVar4._M_current = iStack_150._M_current;
        puVar3 = local_158;
        if (local_80 == (TableCache *)0x0) {
          if (local_158 != iStack_150._M_current) {
            uVar8 = (long)iStack_150._M_current - (long)local_158 >> 3;
            lVar7 = 0x3f;
            if (uVar8 != 0) {
              for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_158,iStack_150._M_current,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar3,iVar4._M_current);
          }
          if ((long)iStack_150._M_current - (long)local_158 != 0) {
            uVar8 = (long)iStack_150._M_current - (long)local_158 >> 3;
            uVar9 = 0;
            do {
              RecoverLogFile((DBImpl *)local_138,(uint64_t)edit,SUB81(local_158[uVar9],0),
                             (bool *)(ulong)(uVar9 == uVar8 - 1),local_f8,(SequenceNumber *)local_b8
                            );
              DVar2._vptr_DB = local_160._vptr_DB;
              local_160._vptr_DB = (_func_int **)local_138._0_8_;
              local_138._0_8_ = DVar2._vptr_DB;
              if ((pointer)DVar2._vptr_DB != (pointer)0x0) {
                operator_delete__(DVar2._vptr_DB);
              }
              if ((pointer)local_160._vptr_DB != (pointer)0x0) {
                (this->super_DB)._vptr_DB = local_160._vptr_DB;
                local_160._vptr_DB = (_func_int **)0x0;
                goto LAB_00109573;
              }
              VersionSet::MarkFileNumberUsed
                        ((VersionSet *)edit[3].next_file_number_,local_158[uVar9]);
              uVar9 = uVar9 + 1;
              uVar8 = (long)iStack_150._M_current - (long)local_158 >> 3;
            } while (uVar9 < uVar8);
          }
          if (*(Logger **)(edit[3].next_file_number_ + 0x58) < local_f0) {
            *(Logger **)(edit[3].next_file_number_ + 0x58) = local_f0;
          }
          (this->super_DB)._vptr_DB = (_func_int **)0x0;
        }
        else {
          snprintf((char *)local_138,0x32,"%d missing files; e.g.");
          local_78._0_8_ = (FileLock *)local_138;
          local_78._8_8_ = strlen((char *)local_138);
          TableFileName(&local_68,(string *)dbname,
                        (uint64_t)((_Alloc_hider *)(local_90._M_allocated_capacity + 0x20))->_M_p);
          local_40.data_ = local_68._M_dataplus._M_p;
          local_40.size_ = local_68._M_string_length;
          Status::Status((Status *)this,kCorruption,(Slice *)local_78,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
LAB_00109573:
        if (local_158 != (unsigned_long *)0x0) {
          operator_delete(local_158);
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)local_a8);
      }
      else {
        (this->super_DB)._vptr_DB = local_160._vptr_DB;
        local_160._vptr_DB = (_func_int **)0x0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
      goto LAB_001090b4;
    }
  }
LAB_001090a8:
  (this->super_DB)._vptr_DB = local_160._vptr_DB;
  local_160._vptr_DB = (_func_int **)0x0;
LAB_001090b4:
  if ((pointer)local_160._vptr_DB != (pointer)0x0) {
    operator_delete__(local_160._vptr_DB);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    snprintf(buf, sizeof(buf), "%d missing files; e.g.",
             static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}